

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O2

void __thiscall leveldb::RecoveryTest::RecoveryTest(RecoveryTest *this)

{
  Env *pEVar1;
  Status SStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  Options local_80;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__RecoveryTest_00171398;
  (this->dbname_)._M_dataplus._M_p = (pointer)&(this->dbname_).field_2;
  (this->dbname_)._M_string_length = 0;
  (this->dbname_).field_2._M_local_buf[0] = '\0';
  pEVar1 = Env::Default();
  this->env_ = pEVar1;
  this->db_ = (DB *)0x0;
  testing::TempDir_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80,
                 &local_a0,"/recovery_test");
  std::__cxx11::string::operator=((string *)&this->dbname_,(string *)&local_80);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  Options::Options(&local_80);
  DestroyDB((leveldb *)&SStack_a8,&this->dbname_,&local_80);
  Status::~Status(&SStack_a8);
  Open(this,(Options *)0x0);
  return;
}

Assistant:

RecoveryTest() : env_(Env::Default()), db_(nullptr) {
    dbname_ = testing::TempDir() + "/recovery_test";
    DestroyDB(dbname_, Options());
    Open();
  }